

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O1

int OpenMD::lexi_cast<int>(string *str)

{
  long *plVar1;
  int result;
  istringstream iss;
  int local_18c;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)str,_S_in);
  plVar1 = (long *)std::istream::operator>>(local_188,&local_18c);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"lexi_cast Error",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return local_18c;
}

Assistant:

T lexi_cast(const std::string& str) {
    T result;
    std::istringstream iss(str);
    if (!(iss >> result)) { std::cerr << "lexi_cast Error" << std::endl; }
    return result;
  }